

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Options::add_entry<int&>
          (Options *this,option *opt,char flag,string *long_flag,string *description,string *group,
          bool req_arg)

{
  int iVar1;
  bool bVar2;
  __type_conflict1 _Var3;
  uint uVar4;
  size_type sVar5;
  runtime_error *prVar6;
  pointer this_00;
  char *pcVar7;
  ostream *poVar8;
  ulong uVar9;
  mapped_type *this_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  uint local_81c;
  float local_814;
  size_type local_7f0;
  value_type local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  allocator<char> local_711;
  string local_710 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  allocator<char> local_6c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  uint local_684;
  uint local_680;
  uint i;
  uint column_width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  uint local_638;
  uint local_634;
  uint desc_pos;
  uint width;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  string local_5c8 [39];
  allocator<char> local_5a1;
  string local_5a0 [32];
  stringstream local_580 [8];
  stringstream ss_2;
  ostream local_570 [376];
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  undefined1 local_3e0;
  undefined1 local_3d1;
  string local_3d0 [32];
  stringstream local_3b0 [8];
  stringstream ss_1;
  ostream local_3a0 [376];
  _Self local_228;
  _Self local_220;
  undefined1 local_211;
  string local_210 [48];
  stringstream local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [376];
  _Self local_58;
  int local_4c;
  _Self local_48;
  byte local_39;
  string *psStack_38;
  bool req_arg_local;
  string *group_local;
  string *description_local;
  string *long_flag_local;
  option *poStack_18;
  char flag_local;
  option *opt_local;
  Options *this_local;
  
  local_39 = req_arg;
  psStack_38 = group;
  group_local = description;
  description_local = long_flag;
  long_flag_local._7_1_ = flag;
  poStack_18 = opt;
  opt_local = (option *)this;
  if ((flag != '\0') ||
     (sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (long_flag), sVar5 != 0)) {
    if (long_flag_local._7_1_ == '\0') {
      iVar1 = this->optval;
      this->optval = iVar1 + 1;
      poStack_18->val = iVar1;
    }
    else {
      local_4c = (int)long_flag_local._7_1_;
      local_48._M_node =
           (_Base_ptr)
           std::
           map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
           ::find(&this->setters,&local_4c);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
           ::end(&this->setters);
      bVar2 = std::operator==(&local_48,&local_58);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_1e0);
        poVar8 = std::operator<<(local_1d0,"Duplicate flag \'");
        poVar8 = std::operator<<(poVar8,long_flag_local._7_1_);
        std::operator<<(poVar8,"\'");
        local_211 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_210);
        local_211 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&this->optstr,long_flag_local._7_1_);
      if ((local_39 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&this->optstr,":");
      }
      poStack_18->val = (int)long_flag_local._7_1_;
    }
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (long_flag);
    if (sVar5 != 0) {
      local_220._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->long_flags,long_flag);
      local_228._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->long_flags);
      bVar2 = std::operator==(&local_220,&local_228);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_3b0);
        poVar8 = std::operator<<(local_3a0,"Duplicate long flag \"");
        poVar8 = std::operator<<(poVar8,(string *)long_flag);
        std::operator<<(poVar8,"\"");
        local_3d1 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_3d0);
        local_3d1 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar10 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(&this->long_flags,long_flag);
      local_3f8 = (_Base_ptr)pVar10.first._M_node;
      local_3f0 = pVar10.second;
      local_3e8._M_node = local_3f8;
      local_3e0 = local_3f0;
      this_00 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator->(&local_3e8);
      pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(this_00);
      poStack_18->name = pcVar7;
    }
    poStack_18->flag = (int *)0x0;
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (description);
    if (sVar5 != 0) {
      std::__cxx11::stringstream::stringstream(local_580);
      uVar4 = this->IndentFlag;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_5a0,(ulong)uVar4,' ',&local_5a1);
      std::operator<<(local_570,local_5a0);
      std::__cxx11::string::~string(local_5a0);
      std::allocator<char>::~allocator(&local_5a1);
      if (long_flag_local._7_1_ != '\0') {
        poVar8 = std::operator<<(local_570,"-");
        poVar8 = std::operator<<(poVar8,long_flag_local._7_1_);
        std::operator<<(poVar8," ");
      }
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (long_flag);
      if (sVar5 != 0) {
        poVar8 = std::operator<<(local_570,"--");
        poVar8 = std::operator<<(poVar8,(string *)long_flag);
        std::operator<<(poVar8," ");
      }
      desc.field_2._M_local_buf[0xf] = '\0';
      std::__cxx11::stringstream::str();
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(&local_5e8);
      if (this->IndentDescription < sVar5) {
        local_7f0 = 1;
      }
      else {
        uVar4 = this->IndentDescription;
        std::__cxx11::stringstream::str();
        desc.field_2._M_local_buf[0xf] = '\x01';
        local_7f0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::length(&local_608);
        local_7f0 = uVar4 - local_7f0;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_5c8,local_7f0,' ',(allocator<char> *)(desc.field_2._M_local_buf + 0xe));
      std::operator<<(local_570,local_5c8);
      std::__cxx11::string::~string(local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xe));
      if ((desc.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_608);
      }
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::string((string *)&desc_pos,description);
      local_634 = tty_width(this);
      uVar9 = (ulong)local_634;
      i._3_1_ = 0;
      std::__cxx11::stringstream::str();
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(&local_658);
      local_814 = (float)(uVar9 - sVar5);
      if (local_814 <= (float)local_634 * 0.3) {
        local_81c = this->IndentFlag + 2;
      }
      else {
        std::__cxx11::stringstream::str();
        i._3_1_ = 1;
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &column_width);
        local_81c = (uint)sVar5;
      }
      if ((i._3_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&column_width);
      }
      std::__cxx11::string::~string((string *)&local_658);
      local_638 = local_81c;
      local_680 = local_634 - local_81c;
      if (local_81c == this->IndentFlag + 2) {
        std::operator<<(local_570,'\n');
      }
      for (local_684 = 0; uVar9 = (ulong)local_684,
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &desc_pos), uVar9 < sVar5; local_684 = local_680 + local_684) {
        while( true ) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_6a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_pos,
                     (ulong)local_684,1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8," ",&local_6c9);
          _Var3 = std::operator==(&local_6a8,&local_6c8);
          std::__cxx11::string::~string((string *)&local_6c8);
          std::allocator<char>::~allocator(&local_6c9);
          std::__cxx11::string::~string((string *)&local_6a8);
          if (!_Var3) break;
          local_684 = local_684 + 1;
        }
        uVar4 = local_684 + local_680;
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_pos)
        ;
        if (uVar4 < sVar5) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_6f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_pos,
                     (ulong)local_684,(ulong)local_680);
          poVar8 = std::operator<<(local_570,(string *)&local_6f0);
          poVar8 = std::operator<<(poVar8,'\n');
          uVar9 = (ulong)local_638;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_710,uVar9,' ',&local_711);
          std::operator<<(poVar8,local_710);
          std::__cxx11::string::~string(local_710);
          std::allocator<char>::~allocator(&local_711);
          std::__cxx11::string::~string((string *)&local_6f0);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_738,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_pos,
                     (ulong)local_684,0xffffffffffffffff);
          std::operator<<(local_570,(string *)&local_738);
          std::__cxx11::string::~string((string *)&local_738);
        }
      }
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->usage,group);
      std::__cxx11::stringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&desc_pos);
      std::__cxx11::stringstream::~stringstream(local_580);
    }
  }
  return;
}

Assistant:

inline void Options::add_entry(struct option& opt, char flag, std::string long_flag, std::string description, std::string group, bool req_arg) {
    if (!flag && !long_flag.size()) return;

    if (flag) {
        if (this->setters.find((int)(flag)) != this->setters.end()) {
            std::stringstream ss;
            ss << "Duplicate flag '" << flag << "'";
            throw std::runtime_error(ss.str());
        }
        this->optstr += flag;
        if (req_arg) this->optstr += ":";

        opt.val = flag;
    } else {
        opt.val = this->optval++;
    }

    if (long_flag.size()) {
        if (this->long_flags.find(long_flag) != this->long_flags.end()) {
            std::stringstream ss;
            ss << "Duplicate long flag \"" << long_flag << "\"";
            throw std::runtime_error(ss.str());
        }
        opt.name = this->long_flags.insert(long_flag).first->c_str();
    }
    opt.flag = NULL;

    if (description.size()) {
        std::stringstream ss;
        ss << std::string(IndentFlag, ' ');

        if (flag) ss << "-" << flag << " ";
        if (long_flag.size()) ss << "--" << long_flag << " ";
        ss << std::string(ss.str().length() > IndentDescription ? 1 : IndentDescription - ss.str().length(), ' ');

        std::string desc(description);
        if (std::is_same<T, bool&>::value) desc.append(std::string(" <switch>"));

        unsigned width = tty_width();
        unsigned desc_pos = width - ss.str().length() > width * 0.3f ? (unsigned)ss.str().length() : IndentFlag + 2;
        unsigned column_width = width - desc_pos;
        if (desc_pos == IndentFlag + 2) ss << '\n';

        for (unsigned i = 0; i < desc.size(); i += column_width) {
            while (desc.substr(i, 1) == std::string(" ")) ++i;
            if (i + column_width < desc.size()) {
                ss << desc.substr(i, column_width) << '\n' << std::string(desc_pos, ' ');
            } else {
                ss << desc.substr(i);
            }
        }

        this->usage[group].push_back(ss.str());
    }
}